

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::SectionNode::SectionNode(SectionNode *this,SectionStats *_stats)

{
  SectionStats *in_RDI;
  SectionStats *in_stack_ffffffffffffffe0;
  
  SharedImpl<Catch::IShared>::SharedImpl((SharedImpl<Catch::IShared> *)in_stack_ffffffffffffffe0);
  in_RDI->_vptr_SectionStats = (_func_int **)&PTR__SectionNode_001ff948;
  SectionStats::SectionStats(in_stack_ffffffffffffffe0,in_RDI);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::vector((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            *)0x1c628a);
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)0x1c629a);
  std::__cxx11::string::string((string *)&in_RDI[1].sectionInfo.field_0x38);
  std::__cxx11::string::string((string *)&in_RDI[1].sectionInfo.lineInfo.field_0x18);
  return;
}

Assistant:

explicit SectionNode( SectionStats const& _stats ) : stats( _stats ) {}